

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.cpp
# Opt level: O3

void Png_Operation::Save(string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
                        uint32_t height)

{
  uchar *puVar1;
  byte bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  FILE *__stream;
  png_structp ppVar5;
  png_infop ppVar6;
  void *__ptr;
  size_t __size;
  void *pvVar7;
  imageException *this;
  long lVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  undefined1 auVar13 [16];
  png_infop info;
  png_structp png;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,startX,startY,width,height);
  __stream = fopen((path->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Cannot create file for saving");
LAB_001099cb:
    __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
  }
  ppVar5 = (png_structp)png_create_write_struct("1.6.37",0,0,0);
  png = ppVar5;
  if (ppVar5 == (png_structp)0x0) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Cannot create file for saving");
    goto LAB_001099cb;
  }
  ppVar6 = (png_infop)png_create_info_struct(ppVar5);
  info = ppVar6;
  if (ppVar6 == (png_infop)0x0) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Cannot create file for saving");
    goto LAB_001099cb;
  }
  png_init_io(ppVar5,__stream);
  png_set_IHDR(ppVar5,ppVar6,width,height,8,6,0,0,0);
  png_write_info(ppVar5,ppVar6);
  uVar11 = (ulong)height;
  __ptr = malloc(uVar11 * 8);
  __size = png_get_rowbytes(ppVar5,ppVar6);
  if (height != 0) {
    uVar10 = 0;
    do {
      pvVar7 = malloc(__size);
      *(void **)((long)__ptr + uVar10 * 8) = pvVar7;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    if (height != 0) {
      auVar13[8] = 0xff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13[9] = 0xff;
      auVar13[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13[0xc] = 0xff;
      auVar13[0xd] = 0xff;
      auVar13[0xe] = 0xff;
      auVar13[0xf] = 0xff;
      uVar10 = 0;
      bVar2 = image->_colorCount;
      puVar12 = image->_data + (ulong)(startX * bVar2) + (ulong)(startY * image->_rowSize);
      do {
        lVar3 = *(long *)((long)__ptr + uVar10 * 8);
        if (bVar2 == 1) {
          if (width != 0) {
            lVar8 = 0;
            do {
              auVar4 = vpinsrb_avx(auVar13,(uint)puVar12[lVar8],0);
              auVar4 = vpshufb_avx(auVar4,SUB6416(ZEXT464(0x1000000),0));
              *(int *)(lVar3 + lVar8 * 4) = auVar4._0_4_;
              lVar8 = lVar8 + 1;
            } while (width != (uint32_t)lVar8);
          }
        }
        else if (width != 0) {
          lVar8 = 0;
          puVar9 = puVar12;
          do {
            *(uchar *)(lVar3 + 2 + lVar8 * 4) = *puVar9;
            *(uchar *)(lVar3 + 1 + lVar8 * 4) = puVar9[1];
            puVar1 = puVar9 + 2;
            puVar9 = puVar9 + 3;
            *(uchar *)(lVar3 + lVar8 * 4) = *puVar1;
            *(undefined1 *)(lVar3 + 3 + lVar8 * 4) = 0xff;
            lVar8 = lVar8 + 1;
          } while (width != (uint32_t)lVar8);
        }
        uVar10 = uVar10 + 1;
        puVar12 = puVar12 + image->_rowSize;
      } while (uVar10 != uVar11);
      png_write_image(ppVar5,__ptr);
      png_write_end(ppVar5,0);
      fclose(__stream);
      if (height != 0) {
        uVar10 = 0;
        do {
          free(*(void **)((long)__ptr + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      goto LAB_0010994d;
    }
  }
  png_write_image(ppVar5,__ptr);
  png_write_end(ppVar5,0);
  fclose(__stream);
LAB_0010994d:
  free(__ptr);
  png_destroy_write_struct(&png,&info);
  return;
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        FILE * file = fopen( path.data(), "wb" );
        if( !file )
            throw imageException( "Cannot create file for saving" );

        png_structp png = png_create_write_struct( PNG_LIBPNG_VER_STRING, NULL, NULL, NULL );
        if( !png )
            throw imageException( "Cannot create file for saving" );

        png_infop info = png_create_info_struct( png );
        if( !info )
            throw imageException( "Cannot create file for saving" );

        png_init_io( png, file );

        // Output is 8bit depth, RGBA format
        png_set_IHDR( png, info, width, height, 8, PNG_COLOR_TYPE_RGBA, PNG_INTERLACE_NONE,
                      PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT );

        png_write_info( png, info );

        uint8_t ** row_pointers = reinterpret_cast<uint8_t**>( malloc( sizeof( uint8_t* ) * height ) );

        const size_t rowByteCount = png_get_rowbytes( png, info );

        for( uint32_t y = 0; y < height; ++y )
            row_pointers[y] = reinterpret_cast<uint8_t*>( malloc( rowByteCount ) );

        const bool grayScaleImage = image.colorCount() == PenguinV_Image::GRAY_SCALE;

        const uint8_t * outY = image.data() + startY * image.rowSize() + startX * image.colorCount();
        for( uint32_t y = 0; y < height; ++y, outY += image.rowSize() ) {
            uint8_t * column = row_pointers[y];
            const uint8_t * outX = outY;

            if( grayScaleImage )
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[0] = column[1] = column[2] = *(outX++);
                    column[3] = 255;
                }
            }
            else
            {
                for( uint32_t x = 0; x < width; ++x, column += 4 ) {
                    column[2] = *(outX++);
                    column[1] = *(outX++);
                    column[0] = *(outX++);
                    column[3] = 255;
                }
            }
        }

        png_write_image( png, row_pointers );
        png_write_end( png, NULL );

        fclose( file );

        for( uint32_t y = 0; y < height; ++y )
            free( row_pointers[y] );
        free( row_pointers );

        png_destroy_write_struct( &png, &info );
    }